

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestMemoryOutStream.cpp
# Opt level: O2

void __thiscall
anon_unknown.dwarf_2435f::TestStreamingSizeTWritesCorrectCharacters::RunImpl
          (TestStreamingSizeTWritesCorrectCharacters *this)

{
  TestResults *results;
  TestResults **ppTVar1;
  char *actual;
  TestDetails **ppTVar2;
  TestDetails TStack_1c8;
  MemoryOutStream stream;
  
  UnitTest::MemoryOutStream::MemoryOutStream(&stream);
  std::ostream::_M_insert<unsigned_long>((ulong)&stream);
  ppTVar1 = UnitTest::CurrentTest::Results();
  results = *ppTVar1;
  actual = UnitTest::MemoryOutStream::GetText(&stream);
  ppTVar2 = UnitTest::CurrentTest::Details();
  UnitTest::TestDetails::TestDetails(&TStack_1c8,*ppTVar2,0x57);
  UnitTest::CheckEqual(results,"53124",actual,&TStack_1c8);
  UnitTest::MemoryOutStream::~MemoryOutStream(&stream);
  return;
}

Assistant:

TEST(StreamingSizeTWritesCorrectCharacters)
{
    MemoryOutStream stream;
    size_t const s = 53124;
    stream << s;
    CHECK_EQUAL("53124", stream.GetText());
}